

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void asm_snap_alloc1(ASMState *as,IRRef ref)

{
  IRIns *ir;
  IRIns *pIVar1;
  byte bVar2;
  Reg RVar3;
  IRIns *pIVar4;
  long lVar5;
  short sVar6;
  uint uVar7;
  IRIns *pIVar8;
  uint uVar9;
  bool bVar10;
  
  while( true ) {
    if (ref < 0x8000) {
      return;
    }
    ir = as->ir + ref;
    if ((ir->field_1).r == 0xfd) {
      return;
    }
    as->snapfilt1 = as->snapfilt1 | 1L << ((byte)ref & 0x3f);
    uVar7 = ref + 0xfb3ee249;
    uVar9 = (uVar7 ^ ref) - (uVar7 * 0x4000 | uVar7 >> 0x12);
    as->snapfilt2 =
         as->snapfilt2 | 1L << (((byte)(uVar7 >> 0xd) ^ (byte)uVar9) - (char)(uVar9 >> 0x13) & 0x3f)
    ;
    if (-1 < (char)(ir->field_1).r) {
      return;
    }
    if ((ir->field_1).s != '\0') {
      return;
    }
    if ((ir->field_1).r != 0xfe) break;
    (ir->field_1).r = 0xfd;
    if ((ir->field_1).o != 'T') {
      pIVar4 = as->ir + (as->snapref - 1);
      goto LAB_00140d56;
    }
    ref = (IRRef)(ir->field_0).op2;
  }
  if (((ir->field_1).o == '[') && ((ir->field_0).op2 == 0x1d3)) {
    uVar7 = as->curins;
    bVar10 = ref < uVar7;
    if (ref < uVar7) {
      pIVar4 = as->ir + uVar7;
      do {
        if ((((pIVar4->field_0).op1 == ref) || ((pIVar4->field_0).op2 == ref)) &&
           (1 < (byte)((pIVar4->field_1).r + 3))) goto LAB_00140cd8;
        pIVar4 = pIVar4 + -1;
        bVar10 = ir < pIVar4;
      } while (ir < pIVar4);
    }
    asm_snap_alloc1(as,(uint)(ir->field_0).op1);
LAB_00140cd8:
    if (!bVar10) {
      return;
    }
  }
  bVar2 = ((ir->field_1).t.irt & 0x1f) - 0xd;
  uVar7 = 0xbfef;
  if (bVar2 < 2) {
    uVar7 = 0xffff0000;
  }
  if ((as->freeset & uVar7) != 0) {
LAB_00140d01:
    RVar3 = ra_allocref(as,ref,uVar7);
    if (((ir->field_1).t.irt & 0x40) == 0) {
      as->weakset = as->weakset | 1 << ((byte)RVar3 & 0x1f);
    }
    if (as->mclim <= as->mcp) {
      return;
    }
    asm_mclimit(as);
  }
  if (bVar2 < 2) {
    lVar5 = 0;
    do {
      sVar6 = (short)as->cost[lVar5 + 0x10];
      if (-1 < sVar6) break;
      bVar10 = lVar5 != 0xf;
      lVar5 = lVar5 + 1;
    } while (bVar10);
    if (-1 < sVar6) goto LAB_00140d01;
  }
  ra_spill(as,ir);
  return;
LAB_00140d56:
  if (pIVar4 <= ir) {
    return;
  }
  if ((pIVar4->field_1).r == 0xfe) {
    if ((ulong)(pIVar4->field_1).s == 0xff) {
      uVar7 = (pIVar4->field_1).o - 0x4a;
      if ((4 < uVar7) || (uVar7 == 2)) goto LAB_00140dc9;
      pIVar1 = as->ir;
      pIVar8 = pIVar1 + (pIVar4->field_0).op1;
      if (((pIVar8->field_1).o & 0xfe) == 0x38) {
        pIVar8 = pIVar1 + (pIVar8->field_0).op1;
      }
      bVar10 = pIVar1 + (pIVar8->field_0).op1 == ir;
    }
    else {
      bVar10 = pIVar4 == ir + (pIVar4->field_1).s;
    }
    if (bVar10) {
      asm_snap_alloc1(as,(uint)(pIVar4->field_0).op2);
    }
  }
LAB_00140dc9:
  pIVar4 = pIVar4 + -1;
  goto LAB_00140d56;
}

Assistant:

static void asm_snap_alloc1(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (!irref_isk(ref) && ir->r != RID_SUNK) {
    bloomset(as->snapfilt1, ref);
    bloomset(as->snapfilt2, hashrot(ref, ref + HASH_BIAS));
    if (ra_used(ir)) return;
    if (ir->r == RID_SINK) {
      ir->r = RID_SUNK;
#if LJ_HASFFI
      if (ir->o == IR_CNEWI) {  /* Allocate CNEWI value. */
	asm_snap_alloc1(as, ir->op2);
	if (LJ_32 && (ir+1)->o == IR_HIOP)
	  asm_snap_alloc1(as, (ir+1)->op2);
      } else
#endif
      {  /* Allocate stored values for TNEW, TDUP and CNEW. */
	IRIns *irs;
	lj_assertA(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW,
		   "sink of IR %04d has bad op %d", ref - REF_BIAS, ir->o);
	for (irs = IR(as->snapref-1); irs > ir; irs--)
	  if (irs->r == RID_SINK && asm_sunk_store(as, ir, irs)) {
	    lj_assertA(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		       irs->o == IR_FSTORE || irs->o == IR_XSTORE,
		       "sunk store IR %04d has bad op %d",
		       (int)(irs - as->ir) - REF_BIAS, irs->o);
	    asm_snap_alloc1(as, irs->op2);
	    if (LJ_32 && (irs+1)->o == IR_HIOP)
	      asm_snap_alloc1(as, (irs+1)->op2);
	  }
      }
    } else {
      RegSet allow;
      if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT) {
	IRIns *irc;
	for (irc = IR(as->curins); irc > ir; irc--)
	  if ((irc->op1 == ref || irc->op2 == ref) &&
	      !(irc->r == RID_SINK || irc->r == RID_SUNK))
	    goto nosink;  /* Don't sink conversion if result is used. */
	asm_snap_alloc1(as, ir->op1);
	return;
      }
    nosink:
      allow = (!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR;
      if ((as->freeset & allow) ||
	       (allow == RSET_FPR && asm_snap_canremat(as))) {
	/* Get a weak register if we have a free one or can rematerialize. */
	Reg r = ra_allocref(as, ref, allow);  /* Allocate a register. */
	if (!irt_isphi(ir->t))
	  ra_weak(as, r);  /* But mark it as weakly referenced. */
	checkmclim(as);
	RA_DBGX((as, "snapreg   $f $r", ref, ir->r));
      } else {
	ra_spill(as, ir);  /* Otherwise force a spill slot. */
	RA_DBGX((as, "snapspill $f $s", ref, ir->s));
      }
    }
  }
}